

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O1

RC __thiscall QO_Manager::Compute(QO_Manager *this,QO_Rel *relOrder,float *costEst,float *tupleEst)

{
  pointer pmVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  RC RVar5;
  int iVar6;
  long lVar7;
  mapped_type *ppcVar8;
  float *pfVar9;
  QO_Rel *pQVar10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  float *pfVar13;
  int iVar14;
  uint *puVar15;
  _Rb_tree_header *p_Var16;
  _Rb_tree_header *p_Var17;
  uint uVar18;
  _Rb_tree_header *p_Var19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  bool bVar23;
  byte bVar24;
  int relsInJoin;
  vector<int,_std::allocator<int>_> allSubsets;
  uint local_9c;
  byte local_95;
  RC local_94;
  long local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  float *local_48;
  float *local_40;
  QO_Rel *local_38;
  
  pfVar9 = tupleEst;
  RVar5 = InitializeBaseCases(this);
  if (RVar5 == 0) {
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    bVar3 = 0 < this->nRels;
    RVar5 = (RC)pfVar9;
    local_48 = costEst;
    local_40 = tupleEst;
    local_38 = relOrder;
    if (0 < this->nRels) {
      uVar21 = 0;
      do {
        bVar23 = 0x20 < uVar21;
        iVar6 = 1 << ((byte)uVar21 & 0x1f);
        if (bVar23) {
          iVar6 = 0;
        }
        pQVar10 = (QO_Rel *)0x19b;
        if (!bVar23) {
          pQVar10 = (QO_Rel *)0x0;
        }
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,iVar6);
        if (!bVar23) {
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_68,
                       (iterator)
                       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_88);
            pQVar10 = (QO_Rel *)((ulong)relOrder & 0xffffffff);
          }
          else {
            *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = iVar6;
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
            pQVar10 = (QO_Rel *)((ulong)relOrder & 0xffffffff);
          }
        }
        RVar5 = (RC)pQVar10;
        if (uVar21 == 0x21) break;
        uVar21 = uVar21 + 1;
        bVar3 = (int)uVar21 < this->nRels;
        relOrder = pQVar10;
      } while ((int)uVar21 < this->nRels);
    }
    if (!bVar3) {
      bVar3 = 1 < this->nRels;
      pfVar13 = local_40;
      pfVar9 = local_48;
      if (1 < this->nRels) {
        local_90 = 1;
        do {
          lVar7 = local_90;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          bVar24 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar15 = (uint *)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          while (local_94 = RVar5, !(bool)bVar24) {
            bVar23 = 0 < this->nRels;
            local_95 = bVar24;
            if (0 < this->nRels) {
              uVar21 = 0;
              do {
                local_9c = 1 << ((byte)uVar21 & 0x1f);
                if (0x20 < uVar21) {
                  local_9c = 0;
                }
                local_9c = local_9c | *puVar15;
                pmVar1 = (this->optcost).
                         super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                p_Var12 = &pmVar1[lVar7 + -1]._M_t._M_impl.super__Rb_tree_header;
                p_Var2 = *(_Base_ptr *)
                          ((long)&pmVar1[lVar7 + -1]._M_t._M_impl.super__Rb_tree_header + 8);
                p_Var11 = &p_Var12->_M_header;
                for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
                    p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < (int)local_9c]) {
                  if ((int)local_9c <= (int)*(size_t *)(p_Var2 + 1)) {
                    p_Var11 = p_Var2;
                  }
                }
                p_Var16 = p_Var12;
                if (((_Rb_tree_header *)p_Var11 != p_Var12) &&
                   (p_Var16 = (_Rb_tree_header *)p_Var11,
                   (int)local_9c < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
                  p_Var16 = p_Var12;
                }
                p_Var17 = &pmVar1[lVar7]._M_t._M_impl.super__Rb_tree_header;
                p_Var2 = *(_Base_ptr *)((long)&pmVar1[lVar7]._M_t._M_impl.super__Rb_tree_header + 8)
                ;
                p_Var11 = &p_Var17->_M_header;
                for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
                    p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < (int)local_9c]) {
                  if ((int)local_9c <= (int)*(size_t *)(p_Var2 + 1)) {
                    p_Var11 = p_Var2;
                  }
                }
                p_Var19 = p_Var17;
                if (((_Rb_tree_header *)p_Var11 != p_Var17) &&
                   (p_Var19 = (_Rb_tree_header *)p_Var11,
                   (int)local_9c < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
                  p_Var19 = p_Var17;
                }
                bVar4 = true;
                if ((((uVar21 < 0x21) && ((*puVar15 & 1 << ((byte)uVar21 & 0x1f)) == 0)) &&
                    (p_Var16 == p_Var12)) && (p_Var19 == p_Var17)) {
                  RVar5 = CalculateOptJoin(this,local_9c,(int)local_90);
                  if (RVar5 == 0) {
                    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_88,
                                 (iterator)
                                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(int *)&local_9c);
                    }
                    else {
                      *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_9c;
                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  else {
                    bVar4 = false;
                    local_94 = RVar5;
                  }
                }
                if (!bVar4) break;
                uVar21 = uVar21 + 1;
                bVar23 = (int)uVar21 < this->nRels;
              } while ((int)uVar21 < this->nRels);
            }
            RVar5 = local_94;
            bVar24 = local_95;
            if (bVar23) goto LAB_0011552e;
            puVar15 = (uint *)((long)puVar15 + 4);
            bVar24 = puVar15 ==
                     (uint *)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
          }
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish !=
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start) {
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          std::vector<int,_std::allocator<int>_>::operator=(&local_68,&local_88);
LAB_0011552e:
          pfVar13 = local_40;
          pfVar9 = local_48;
          if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if ((bVar24 & 1) == 0) break;
          local_90 = local_90 + 1;
          bVar3 = local_90 < this->nRels;
        } while (local_90 < this->nRels);
      }
      if (!bVar3) {
        iVar6 = this->nRels;
        lVar7 = (long)iVar6;
        bVar3 = 0 < lVar7;
        if (lVar7 < 1) {
          uVar21 = 0;
        }
        else {
          uVar21 = 1;
          uVar20 = 0;
          do {
            uVar18 = uVar20;
            if (iVar6 - 1U == uVar18) {
              bVar3 = false;
              goto LAB_001155dc;
            }
            uVar20 = 2 << ((byte)uVar18 & 0x1f);
            if (0x1f < uVar18) {
              uVar20 = 0;
            }
            uVar21 = uVar21 | uVar20;
            uVar20 = uVar18 + 1;
          } while (uVar18 + 1 != 0x21);
          bVar3 = 0x21 < iVar6;
          RVar5 = 0x19b;
          if (uVar18 < 0x20) {
            RVar5 = 0;
          }
        }
LAB_001155dc:
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44((int)((ulong)local_88.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 0x20),
                                     uVar21);
        if (!bVar3) {
          ppcVar8 = std::
                    map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                    ::operator[]((this->optcost).
                                 super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar7 + -1,
                                 (key_type *)&local_88);
          *pfVar9 = (*ppcVar8)->cost;
          ppcVar8 = std::
                    map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                    ::operator[]((this->optcost).
                                 super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (long)this->nRels + -1,
                                 (key_type *)&local_88);
          *pfVar13 = (*ppcVar8)->numTuples;
          iVar6 = this->nRels;
          if (0 < iVar6) {
            iVar14 = 0;
            iVar22 = -1;
            do {
              iVar6 = iVar6 + iVar22;
              ppcVar8 = std::
                        map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                        ::operator[]((this->optcost).
                                     super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + iVar6,
                                     (key_type *)&local_88);
              local_90 = CONCAT44(local_90._4_4_,(*ppcVar8)->joins);
              ppcVar8 = std::
                        map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                        ::operator[]((this->optcost).
                                     super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + iVar6,
                                     (key_type *)&local_88);
              local_38[iVar6].relIdx = (*ppcVar8)->newRelIndex;
              ppcVar8 = std::
                        map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                        ::operator[]((this->optcost).
                                     super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + iVar6,
                                     (key_type *)&local_88);
              pQVar10 = local_38;
              local_38[iVar6].indexAttr = (*ppcVar8)->indexAttr;
              ppcVar8 = std::
                        map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                        ::operator[]((this->optcost).
                                     super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + iVar6,
                                     (key_type *)&local_88);
              pQVar10[iVar6].indexCond = (*ppcVar8)->indexCond;
              local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = (pointer)CONCAT44(local_88.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                                            (undefined4)local_90);
              iVar14 = iVar14 + 1;
              iVar6 = this->nRels;
              iVar22 = iVar22 + -1;
            } while (iVar14 < iVar6);
          }
          RVar5 = 0;
        }
      }
    }
    if ((uint *)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return RVar5;
}

Assistant:

RC QO_Manager::Compute(QO_Rel *relOrder, float &costEst, float &tupleEst){
  RC rc = 0;
  // initialize the base relations
  if((rc = InitializeBaseCases()))
    return (rc);

  // create a vector containing bitmaps that
  // reflect all subsets of size 1
  vector<int> allSubsets;
  for(int i=0; i < nRels; i++){
    int bitmap = 0;
    if((rc = AddRelToBitmap(i, bitmap)))
      return (rc);
    allSubsets.push_back(bitmap);
  }

  for(int i=1; i < nRels; i++){ // for all sizes of subsets
    vector<int> allNewSubsets; // will hold all subsets of size i+1
                               // at the end of the iteration
    // iterate through all sets of the previous size
    vector<int>::iterator it;
    for(it= allSubsets.begin(); it != allSubsets.end(); ++it){
      for(int j=0; j < nRels; j++){ // go through all ways of adding a new relation
        int relsInJoin = *it;
        int newRelsInJoin = relsInJoin;
        AddRelToBitmap(j, newRelsInJoin);
        bool isInOptCost1 = (optcost[i-1].find(newRelsInJoin) != optcost[i-1].end());
        bool isInOptCost2 = (optcost[i].find(newRelsInJoin) != optcost[i].end());
        // If adding this new relation modifies the set (i.e. relation is not)
        // included in the set of the previous size) and we haven't calculated
        // the optimal way of joining this yet, do so
        if(!IsBitSet(j, relsInJoin) && !isInOptCost1 && !isInOptCost2){
          if((rc = CalculateOptJoin(newRelsInJoin, i))){
            return (rc);
          }
          // add this to the set.
          allNewSubsets.push_back(newRelsInJoin);
        }
      }
    }
    allSubsets.clear();
    allSubsets = allNewSubsets;
    // set the previous set of joins of size i to the set of joins
    // of size i+1
  }

  // create the bitmap containing all relations
  int relsInJoin = 0;
  for(int i = 0; i < nRels; i++){
    if((rc = AddRelToBitmap(i, relsInJoin)))
      return (rc);
  }
  // update the overall estimated costs and tuple numbers
  costEst = optcost[nRels-1][relsInJoin]->cost;
  tupleEst = optcost[nRels-1][relsInJoin]->numTuples;
  // backtrace: start with the set of all relations, and use the
  // "joins" field to get the cost stats of the previous opt join, and
  // move them to the appropriate location in QO_Rel array
  for(int i=0; i < nRels; i++){
    int index = nRels-i-1;
    int nextSubJoin = optcost[index][relsInJoin]->joins;
    relOrder[index].relIdx = optcost[index][relsInJoin]->newRelIndex;
    relOrder[index].indexAttr = optcost[index][relsInJoin]->indexAttr;
    relOrder[index].indexCond = optcost[index][relsInJoin]->indexCond;
    relsInJoin = nextSubJoin;
  }

  return (0);
}